

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::SetCurrentBinaryDirectory(cmMakefile *this,string *dir)

{
  char *path;
  string local_40;
  
  cmState::Snapshot::SetCurrentBinaryDirectory(&this->StateSnapshot,dir);
  path = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  cmsys::SystemTools::MakeDirectory(path);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_CURRENT_BINARY_DIR","")
  ;
  AddDefinition(this,&local_40,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::SetCurrentBinaryDirectory(const std::string& dir)
{
  this->StateSnapshot.SetCurrentBinaryDirectory(dir);
  const char* binDir = this->StateSnapshot.GetCurrentBinaryDirectory();
  cmSystemTools::MakeDirectory(binDir);
  this->AddDefinition("CMAKE_CURRENT_BINARY_DIR", binDir);
}